

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speculative.cpp
# Opt level: O2

common_speculative * common_speculative_init(llama_context *ctx_dft)

{
  undefined4 uVar1;
  common_speculative *pcVar2;
  llama_model *model;
  common_sampler *pcVar3;
  undefined4 local_13c;
  common_params_sampling params;
  
  pcVar2 = (common_speculative *)operator_new(0x60);
  pcVar2->ctx = ctx_dft;
  pcVar2->smpl = (common_sampler *)0x0;
  uVar1 = llama_n_batch(ctx_dft);
  llama_batch_init(&pcVar2->batch,uVar1,0,1);
  (pcVar2->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pcVar2->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pcVar2->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  common_params_sampling::common_params_sampling(&params);
  params.no_perf = false;
  params.top_k = 10;
  local_13c = 2;
  std::vector<common_sampler_type,std::allocator<common_sampler_type>>::
  _M_assign_aux<common_sampler_type_const*>
            ((vector<common_sampler_type,std::allocator<common_sampler_type>> *)&params.samplers,
             &local_13c);
  model = (llama_model *)llama_get_model(ctx_dft);
  pcVar3 = common_sampler_init(model,&params);
  pcVar2->smpl = pcVar3;
  common_params_sampling::~common_params_sampling(&params);
  return pcVar2;
}

Assistant:

struct common_speculative * common_speculative_init(
        struct llama_context * ctx_dft) {
    auto * result = new common_speculative {
        /* .ctx    = */ ctx_dft,
        /* .smpl   = */ nullptr,
        /* .batch  = */ llama_batch_init(llama_n_batch(ctx_dft), 0, 1),
        /* .prompt = */ {},
    };

    // TODO: optimize or pass from outside?
#if 0
    {
        common_params_sampling params;
        params.no_perf = false;

        params.top_k = 40;
        params.top_p = 0.9;

        params.samplers = {
            COMMON_SAMPLER_TYPE_TOP_K,
            COMMON_SAMPLER_TYPE_TOP_P,
            COMMON_SAMPLER_TYPE_INFILL,
        };

        result->smpl = common_sampler_init(llama_get_model(ctx_dft), params);
    }
#else
    {
        common_params_sampling params;
        params.no_perf = false;

        params.top_k = 10;

        params.samplers = {
            COMMON_SAMPLER_TYPE_TOP_K,
        };

        result->smpl = common_sampler_init(llama_get_model(ctx_dft), params);
    }
#endif

    return result;
}